

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

bool __thiscall S2Polyline::IsValid(S2Polyline *this)

{
  bool bVar1;
  S2LogMessage local_50;
  S2Error error;
  
  error.code_ = OK;
  error.text_._M_dataplus._M_p = (pointer)&error.text_.field_2;
  error.text_._M_string_length = 0;
  error.text_.field_2._M_local_buf[0] = '\0';
  bVar1 = FindValidationError(this,&error);
  if ((bVar1) && (FLAGS_s2debug == true)) {
    S2LogMessage::S2LogMessage
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0x78,kError,(ostream *)&std::cerr);
    ::operator<<(local_50.stream_,&error);
    S2LogMessage::~S2LogMessage(&local_50);
  }
  std::__cxx11::string::~string((string *)&error.text_);
  return !bVar1;
}

Assistant:

bool S2Polyline::IsValid() const {
  S2Error error;
  if (FindValidationError(&error)) {
    S2_LOG_IF(ERROR, FLAGS_s2debug) << error;
    return false;
  }
  return true;
}